

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  undefined1 *__n;
  pointer pbVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  cmDuration cVar4;
  cmCTest cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Repeat RVar9;
  size_t sVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  char *pcVar13;
  void *__s1;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Alloc_hider _Var16;
  char *in_R8;
  size_type __rlen_26;
  size_type __rlen;
  size_type __rlen_28;
  string_view varg1;
  string_view varg1_00;
  string_view varg1_01;
  string_view varg1_02;
  string_view varg1_03;
  string_view varg1_04;
  string_view varg1_05;
  string_view varg1_06;
  string_view varg1_07;
  string_view varg1_08;
  string_view varg1_09;
  string_view varg1_10;
  string_view varg1_11;
  string_view varg1_12;
  string_view varg1_13;
  string_view varg1_14;
  string_view varg1_15;
  string_view varg1_16;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string arg;
  string format;
  unsigned_long load;
  ostringstream cmCTestLog_msg;
  unsigned_long n;
  cmCTest local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  long local_240 [2];
  string *local_230;
  undefined1 local_228 [48];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char *local_1a8;
  pointer local_1a0;
  char *local_170;
  char *local_168;
  ios_base local_158 [64];
  char *local_118;
  char *local_108;
  int local_100;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_250.Impl._M_t.
  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
  super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl =
       (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_240;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  local_230 = errormsg;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  if ((local_248 !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&DAT_00000002) ||
     (iVar7 = bcmp((void *)local_250.Impl._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,"-F",2),
     iVar7 != 0)) {
    varg1._M_str = "--parallel";
    varg1._M_len = (size_t)"-j";
    bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1,in_R8);
    if (bVar6) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar10 = *i + 1;
        *i = sVar10;
        iVar8 = atoi(pbVar1[sVar10]._M_dataplus._M_p);
        iVar7 = 1;
        if (1 < iVar8) {
          iVar7 = iVar8;
        }
        _Var3._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var3._M_head_impl)->ParallelLevel = iVar7;
        (_Var3._M_head_impl)->ParallelLevelSetInCli = true;
        goto LAB_0018c894;
      }
    }
    local_1c8._0_8_ = local_248;
    local_1c8._8_8_ =
         local_250.Impl._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    __str._M_str = "-j";
    __str._M_len = 2;
    pcVar13 = "-j";
    iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,2,__str);
    paVar15 = local_248;
    cVar5.Impl._M_t.super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
    _M_t.super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
    super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl =
         local_250.Impl._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (iVar7 == 0) {
      std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_250);
      uVar14 = local_1c8._0_8_;
      iVar7 = atoi((char *)local_1c8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar14 != &local_1b8) {
        operator_delete((void *)uVar14,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      iVar8 = 1;
      if (1 < iVar7) {
        iVar8 = iVar7;
      }
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var3._M_head_impl)->ParallelLevel = iVar8;
      (_Var3._M_head_impl)->ParallelLevelSetInCli = true;
      goto LAB_0018c894;
    }
    if (local_248 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x8) {
      iVar7 = bcmp((void *)local_250.Impl._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,"--repeat"
                   ,8);
      if (iVar7 != 0) goto LAB_0018c6eb;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i) {
        pcVar13 = "\'--repeat\' requires an argument";
        goto LAB_0018d6ed;
      }
      if (((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode == Never) {
        *i = *i + 1;
        local_118 = (char *)0x0;
        local_108 = (char *)0x0;
        local_100 = 0;
        memset((RegularExpression *)local_1c8,0,0xaa);
        cmsys::RegularExpression::compile
                  ((RegularExpression *)local_1c8,"^(until-fail|until-pass|after-timeout):([0-9]+)$"
                  );
        bVar6 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_1c8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_1c8);
        if (bVar6) {
          if ((undefined1 *)local_1b8._M_allocated_capacity == (undefined1 *)0x0) {
            local_228._0_8_ = local_228 + 0x10;
            local_228._8_8_ = (pointer)0x0;
            local_228[0x10] = '\0';
          }
          else {
            local_228._0_8_ = local_228 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,local_1b8._M_allocated_capacity,local_168);
          }
          local_50._M_dataplus._M_p = &DAT_00000001;
          cmStrToULong((string *)local_228,(unsigned_long *)&local_50);
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatCount =
               (int)local_50._M_dataplus._M_p;
          if (1 < (int)local_50._M_dataplus._M_p) {
            if ((Private *)local_1c8._8_8_ == (Private *)0x0) {
              local_1f8._0_8_ = local_1f8 + 0x10;
              local_1f8._8_8_ = (pointer)0x0;
              local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
            }
            else {
              local_1f8._0_8_ = local_1f8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,local_1c8._8_8_,local_170);
            }
            iVar7 = std::__cxx11::string::compare(local_1f8);
            if (iVar7 == 0) {
              RVar9 = UntilFail;
LAB_0018dee1:
              ((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode = RVar9;
            }
            else {
              iVar7 = std::__cxx11::string::compare(local_1f8);
              if (iVar7 == 0) {
                RVar9 = UntilPass;
                goto LAB_0018dee1;
              }
              iVar7 = std::__cxx11::string::compare(local_1f8);
              if (iVar7 == 0) {
                RVar9 = AfterTimeout;
                goto LAB_0018dee1;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1f8 + 0x10)) {
              operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
            }
          }
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            local_50.field_2._M_allocated_capacity = CONCAT71(local_228._17_7_,local_228[0x10]);
            _Var16._M_p = (pointer)local_228._0_8_;
LAB_0018df15:
            operator_delete(_Var16._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_228._0_8_ = (char *)0x20;
          local_228._8_8_ = "\'--repeat\' given invalid value \'";
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_1f8._8_8_ = pbVar1[*i]._M_dataplus._M_p;
          local_1f8._0_8_ = pbVar1[*i]._M_string_length;
          cmStrCat<char[2]>(&local_50,(cmAlphaNum *)local_228,(cmAlphaNum *)local_1f8,
                            (char (*) [2])0x7a6258);
          std::__cxx11::string::operator=((string *)local_230,(string *)&local_50);
          _Var16._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0018df15;
        }
        if (local_108 != (char *)0x0) {
          operator_delete__(local_108);
        }
        goto LAB_0018df2f;
      }
      pcVar13 = "At most one \'--repeat\' option may be used.";
      goto LAB_0018d22d;
    }
    if ((local_248 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x13) ||
       (iVar7 = bcmp((void *)local_250.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--repeat-until-fail",0x13), iVar7 != 0)) {
LAB_0018c6eb:
      if ((paVar15 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xb) &&
         (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--test-load",0xb), iVar7 == 0)) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
        goto LAB_0018c753;
        sVar10 = *i + 1;
        *i = sVar10;
        bVar6 = cmStrToULong(pbVar1 + sVar10,(unsigned_long *)local_1f8);
        if (bVar6) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestLoad =
               local_1f8._0_8_;
          goto LAB_0018c894;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"Invalid value for \'Test Load\' : ",0x20);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8,pbVar1[*i]._M_dataplus._M_p,
                             pbVar1[*i]._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x7a2,(char *)local_228._0_8_,false);
LAB_0018d7f8:
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        goto LAB_0018c894;
      }
LAB_0018c753:
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0xe) {
        iVar7 = bcmp((void *)cVar5.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--print-labels",0xe);
        if (iVar7 != 0) goto LAB_0018c799;
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->PrintLabels = true;
        goto LAB_0018c894;
      }
      if ((paVar15 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&DAT_00000014) &&
         (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--no-compress-output",0x14), iVar7 == 0)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CompressTestOutput = false;
        goto LAB_0018c894;
      }
LAB_0018c799:
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x9) {
        iVar7 = bcmp((void *)cVar5.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--http1.0",9);
        if (iVar7 == 0) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->UseHTTP10 = true;
          goto LAB_0018c894;
        }
        iVar7 = bcmp((void *)cVar5.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--timeout",9);
        if (iVar7 == 0) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar10 = *i + 1;
            *i = sVar10;
            cVar4.__r = atof(pbVar1[sVar10]._M_dataplus._M_p);
            (((this->Impl)._M_t.
              super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
              super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
              super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->GlobalTimeout).__r =
                 cVar4.__r;
            goto LAB_0018c894;
          }
        }
      }
      if ((paVar15 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xb) &&
         (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--stop-time",0xb), iVar7 == 0)) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar10 = *i + 1;
          *i = sVar10;
          SetStopTime(this,pbVar1 + sVar10);
          goto LAB_0018c894;
        }
      }
      if ((paVar15 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&DAT_00000011) &&
         (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--stop-on-failure",0x11), iVar7 == 0)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->StopOnFailure = true;
        goto LAB_0018c894;
      }
      varg1_04._M_str = "--build-config";
      varg1_04._M_len = (size_t)"-C";
      bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_04,pcVar13);
      paVar15 = local_248;
      cVar5.Impl._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl =
           local_250.Impl._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if (bVar6) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
          sVar10 = *i + 1;
          *i = sVar10;
          SetConfigType(this,pbVar1 + sVar10);
          goto LAB_0018c894;
        }
      }
      if (local_248 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x7) {
        iVar7 = bcmp((void *)local_250.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--debug",7);
        if (iVar7 == 0) {
          _Var3._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          (_Var3._M_head_impl)->Debug = true;
          (_Var3._M_head_impl)->ShowLineNumbers = true;
        }
        else {
          iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--group",7);
          if (((iVar7 != 0) &&
              (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                            "--track",7), iVar7 != 0)) ||
             (((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i))
          goto LAB_0018d23c;
          *i = *i + 1;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                      SpecificGroup);
        }
        goto LAB_0018c894;
      }
LAB_0018d23c:
      if (paVar15 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x12) {
        if (paVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x17) {
LAB_0018d28e:
          iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--no-subproject-summary",(size_t)paVar15);
          if (iVar7 != 0) goto LAB_0018d2a8;
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubprojectSummary = false
          ;
        }
        else {
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x13) goto LAB_0018d2a8;
          iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--show-line-numbers",0x13);
          if (iVar7 != 0) goto LAB_0018d288;
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowLineNumbers = true;
        }
        goto LAB_0018c894;
      }
      iVar7 = bcmp((void *)cVar5.Impl._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                   "--no-label-summary",0x12);
      if (iVar7 == 0) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->LabelSummary = false;
        goto LAB_0018c894;
      }
LAB_0018d288:
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x17) goto LAB_0018d28e;
LAB_0018d2a8:
      varg1_08._M_str = "--quiet";
      varg1_08._M_len = (size_t)"-Q";
      bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_08,pcVar13);
      if (bVar6) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Quiet = true;
        goto LAB_0018c894;
      }
      if ((local_248 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xa) &&
         (iVar7 = bcmp((void *)local_250.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--progress",10), iVar7 == 0)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestProgressOutput = true;
        goto LAB_0018c894;
      }
      varg1_11._M_str = "--verbose";
      varg1_11._M_len = (size_t)"-V";
      bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_11,pcVar13);
      if (bVar6) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Verbose = true;
        goto LAB_0018c894;
      }
      varg1_12._M_str = "--extra-verbose";
      varg1_12._M_len = (size_t)"-VV";
      bVar6 = CheckArgument(&local_250,(string *)0x3,varg1_12,pcVar13);
      paVar15 = local_248;
      cVar5.Impl._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl =
           local_250.Impl._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if (bVar6) {
        _Var3._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var3._M_head_impl)->Verbose = true;
        (_Var3._M_head_impl)->ExtraVerbose = true;
        goto LAB_0018c894;
      }
      if ((local_248 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x13) &&
         (iVar7 = bcmp((void *)local_250.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--output-on-failure",0x13), iVar7 == 0)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
        OutputTestOutputOnTestFailure = true;
        goto LAB_0018c894;
      }
      if (paVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x19) {
        iVar7 = bcmp((void *)cVar5.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--test-output-size-passed",0x19);
        if (iVar7 == 0) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar10 = *i + 1;
            *i = sVar10;
            bVar6 = cmStrToLong(pbVar1 + sVar10,(long *)local_1f8);
            if (!bVar6) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"Invalid value for \'--test-output-size-passed\': ",
                         0x2f);
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1c8,pbVar1[*i]._M_dataplus._M_p,
                                   pbVar1[*i]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                  ,0x7ec,(char *)local_228._0_8_,false);
              goto LAB_0018d7f8;
            }
            *(undefined4 *)
             ((long)&((this->Impl)._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestHandler +
             0x1ac) = local_1f8._0_4_;
            goto LAB_0018c894;
          }
        }
        iVar7 = bcmp((void *)cVar5.Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                     "--test-output-size-failed",0x19);
        if (iVar7 == 0) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
            sVar10 = *i + 1;
            *i = sVar10;
            bVar6 = cmStrToLong(pbVar1 + sVar10,(long *)local_1f8);
            if (bVar6) {
              *(undefined4 *)
               ((long)&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestHandler
               + 0x1b0) = local_1f8._0_4_;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"Invalid value for \'--test-output-size-failed\': ",
                         0x2f);
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1c8,pbVar1[*i]._M_dataplus._M_p,
                                   pbVar1[*i]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                  ,0x7f8,(char *)local_228._0_8_,false);
              if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
                operator_delete((void *)local_228._0_8_,
                                CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base(local_158);
            }
            goto LAB_0018c894;
          }
        }
      }
      if ((paVar15 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x18) ||
         (iVar7 = bcmp((void *)cVar5.Impl._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                       "--test-output-truncation",0x18), iVar7 != 0)) {
LAB_0018dda7:
        varg1_13._M_str = "--show-only";
        varg1_13._M_len = (size_t)"-N";
        bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_13,pcVar13);
        if (bVar6) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
        }
        else {
          local_1c8._0_8_ = local_248;
          local_1c8._8_8_ =
               local_250.Impl._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          __str_01._M_str = "--show-only=";
          __str_01._M_len = 0xc;
          pcVar13 = "--show-only=";
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,0xc,
                             __str_01);
          if (iVar7 == 0) {
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ShowOnly = true;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"--show-only=","");
            std::__cxx11::string::substr((ulong)local_228,(ulong)&local_250);
            iVar7 = std::__cxx11::string::compare(local_228);
            if (iVar7 == 0) {
              _Var3._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              (_Var3._M_head_impl)->Quiet = true;
              (_Var3._M_head_impl)->OutputAsJson = true;
              (_Var3._M_head_impl)->OutputAsJsonVersion = 1;
            }
            else {
              iVar7 = std::__cxx11::string::compare(local_228);
              if (iVar7 != 0) {
                std::operator+(&local_50,"\'--show-only=\' given unknown value \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_228);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
                paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 == paVar15) {
                  local_1f8._16_8_ = paVar15->_M_allocated_capacity;
                  local_1f8._24_8_ = puVar12[3];
                  local_1f8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_1f8 + 0x10);
                }
                else {
                  local_1f8._16_8_ = paVar15->_M_allocated_capacity;
                  local_1f8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar12;
                }
                local_1f8._8_8_ = puVar12[1];
                *puVar12 = paVar15;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_230,(string *)local_1f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_1f8 + 0x10)) {
                  operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
                  operator_delete((void *)local_228._0_8_,
                                  CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
                }
                uVar14 = local_1b8._M_allocated_capacity;
                paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ == &local_1b8) goto LAB_0018cb89;
                goto LAB_0018cb81;
              }
            }
            if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
              operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != &local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
            }
          }
          else {
            varg1_14._M_str = "--output-log";
            varg1_14._M_len = (size_t)"-O";
            bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_14,pcVar13);
            if (bVar6) {
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (*i < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)
              {
                sVar10 = *i + 1;
                *i = sVar10;
                SetOutputLogFileName(this,pbVar1 + sVar10);
                goto LAB_0018c894;
              }
            }
            if (local_248 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x19) {
              iVar7 = bcmp((void *)local_250.Impl._M_t.
                                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                           "--force-new-ctest-process",0x19);
              if (iVar7 != 0) goto LAB_0018df8d;
              ((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess
                   = true;
            }
            else if ((local_248 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0xe) &&
                    (iVar7 = bcmp((void *)local_250.Impl._M_t.
                                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                          .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl,"--tomorrow-tag",0xe), iVar7 == 0)) {
              ((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TomorrowTag = true;
            }
            else {
LAB_0018df8d:
              varg1_15._M_str = "--max-width";
              varg1_15._M_len = (size_t)"-W";
              bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_15,pcVar13);
              if (bVar6) {
                pbVar1 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (*i < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) -
                         1U) {
                  sVar10 = *i + 1;
                  *i = sVar10;
                  iVar7 = atoi(pbVar1[sVar10]._M_dataplus._M_p);
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->MaxTestNameWidth
                       = iVar7;
                  goto LAB_0018c894;
                }
              }
              if (local_248 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xb) {
                iVar7 = bcmp((void *)local_250.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                             "--overwrite",0xb);
                if (iVar7 == 0) {
                  pbVar1 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (*i < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) -
                           1U) {
                    sVar10 = *i + 1;
                    *i = sVar10;
                    AddCTestConfigurationOverwrite(this,pbVar1 + sVar10);
                    goto LAB_0018c894;
                  }
                }
              }
              else if (local_248 ==
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0xe) {
                iVar7 = bcmp((void *)local_250.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                             "--submit-index",0xe);
                if (iVar7 == 0) {
                  pbVar1 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (*i < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) -
                           1U) {
                    sVar10 = *i + 1;
                    *i = sVar10;
                    iVar8 = atoi(pbVar1[sVar10]._M_dataplus._M_p);
                    iVar7 = 0;
                    if (0 < iVar8) {
                      iVar7 = iVar8;
                    }
                    ((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->SubmitIndex =
                         iVar7;
                    goto LAB_0018c894;
                  }
                }
              }
              else if ((local_248 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x18) &&
                      (iVar7 = bcmp((void *)local_250.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl,"--interactive-debug-mode",0x18),
                      iVar7 == 0)) {
                pbVar1 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                value._M_str = (char *)(((long)(args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pbVar1 >> 5) - 1);
                if ((char *)*i < value._M_str) {
                  pcVar13 = (char *)*i + 1;
                  *i = (size_t)pcVar13;
                  value._M_len = (size_t)pbVar1[(long)pcVar13]._M_dataplus._M_p;
                  bVar6 = cmValue::IsOn((cmValue *)pbVar1[(long)pcVar13]._M_string_length,value);
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                  InteractiveDebugMode = bVar6;
                  goto LAB_0018c894;
                }
              }
              varg1_16._M_str = "--add-notes";
              varg1_16._M_len = (size_t)"-A";
              bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_16,pcVar13);
              if ((bVar6) &&
                 (*i < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                ((this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Notes","");
                SetTest(this,(string *)local_1c8,true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != &local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,
                                  (ulong)(local_1b8._M_allocated_capacity + 1));
                }
                *i = *i + 1;
                bVar6 = true;
                std::__cxx11::string::_M_assign
                          ((string *)
                           &((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                            NotesFiles);
                goto LAB_0018d565;
              }
              if (local_248 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xe) {
                iVar7 = bcmp((void *)local_250.Impl._M_t.
                                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                             "--output-junit",0xe);
                if (iVar7 == 0) {
                  pbVar1 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U
                      <= *i) {
                    pcVar13 = "\'--output-junit\' requires an argument";
                    goto LAB_0018d22d;
                  }
                  sVar10 = *i + 1;
                  *i = sVar10;
                  pcVar2 = pbVar1[sVar10]._M_dataplus._M_p;
                  local_1c8._0_8_ = &local_1b8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1c8,pcVar2,pcVar2 + pbVar1[sVar10]._M_string_length);
                  cmCTestTestHandler::SetJUnitXMLFileName
                            (&((this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                              TestHandler,(string *)local_1c8);
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                  CompressTestOutput = false;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._0_8_ != &local_1b8) goto LAB_0018e68f;
                }
              }
              else if ((local_248 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xa) &&
                      (iVar7 = bcmp((void *)local_250.Impl._M_t.
                                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                            .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                            _M_head_impl,"--test-dir",10), iVar7 == 0)) {
                pbVar1 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <=
                    *i) {
                  pcVar13 = "\'--test-dir\' requires an argument";
LAB_0018d22d:
                  std::__cxx11::string::operator=((string *)local_230,pcVar13);
                  goto LAB_0018cb89;
                }
                sVar10 = *i + 1;
                *i = sVar10;
                pcVar2 = pbVar1[sVar10]._M_dataplus._M_p;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1c8,pcVar2,pcVar2 + pbVar1[sVar10]._M_string_length);
                std::__cxx11::string::operator=
                          ((string *)
                           &((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                            TestDir,(string *)local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != &local_1b8) {
LAB_0018e68f:
                  operator_delete((void *)local_1c8._0_8_,
                                  (ulong)(local_1b8._M_allocated_capacity + 1));
                }
              }
            }
          }
        }
        goto LAB_0018c894;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
      goto LAB_0018dda7;
      sVar10 = *i + 1;
      *i = sVar10;
      bVar6 = cmCTestTestHandler::SetTestOutputTruncation
                        (&((this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                          TestHandler,pbVar1 + sVar10);
      if (bVar6) goto LAB_0018c894;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "Invalid value for \'--test-output-truncation\': ",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + *i);
      std::__cxx11::string::operator=((string *)local_230,(string *)local_1c8);
      uVar14 = local_1b8._M_allocated_capacity;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_0018cb89;
      goto LAB_0018cb81;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i) {
      pcVar13 = "\'--repeat-until-fail\' requires an argument";
LAB_0018d6ed:
      bVar6 = false;
      std::__cxx11::string::_M_replace
                ((ulong)local_230,0,(char *)local_230->_M_string_length,(ulong)pcVar13);
      goto LAB_0018d565;
    }
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->RepeatMode != Never) {
      pcVar13 = "At most one \'--repeat\' option may be used.";
      goto LAB_0018d6ed;
    }
    sVar10 = *i + 1;
    *i = sVar10;
    local_50._M_dataplus._M_p = &DAT_00000001;
    bVar6 = cmStrToLong(pbVar1 + sVar10,(long *)&local_50);
    if (bVar6) {
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var3._M_head_impl)->RepeatCount = (int)local_50._M_dataplus._M_p;
      if (1 < (long)local_50._M_dataplus._M_p) {
        (_Var3._M_head_impl)->RepeatMode = UntilFail;
      }
    }
    else {
      local_1c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2f;
      local_1c8._8_8_ = "\'--repeat-until-fail\' given non-integer value \'";
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_228._8_8_ = pbVar1[*i]._M_dataplus._M_p;
      local_228._0_8_ = pbVar1[*i]._M_string_length;
      cmStrCat<char[2]>((string *)local_1f8,(cmAlphaNum *)local_1c8,(cmAlphaNum *)local_228,
                        (char (*) [2])0x7a6258);
      std::__cxx11::string::operator=((string *)local_230,(string *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
      }
    }
LAB_0018df2f:
    if (bVar6 != false) goto LAB_0018c894;
LAB_0018cb89:
    bVar6 = false;
    goto LAB_0018d565;
  }
  ((this->Impl)._M_t.super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
   ._M_t.super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
   super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Failover = true;
LAB_0018c894:
  local_1c8._0_8_ = local_248;
  local_1c8._8_8_ =
       local_250.Impl._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  __str_00._M_str = "--no-tests=";
  __str_00._M_len = 0xb;
  pcVar13 = "--no-tests=";
  iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,0xb,__str_00);
  if (iVar7 == 0) {
    if (local_248 <
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0xb) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",0xb)
      ;
    }
    __n = (undefined1 *)((long)local_248 + -0xb);
    __s1 = (void *)((long)local_250.Impl._M_t.
                          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                          .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0xb);
    if (local_248 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&DAT_00000011) {
      if (local_248 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x10) {
        iVar7 = bcmp(__s1,"error",(size_t)__n);
        if (iVar7 == 0) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Error;
          goto LAB_0018d562;
        }
        if (__n == (undefined1 *)0x6) goto LAB_0018caf5;
      }
LAB_0018cb0f:
      local_1c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x23;
      local_1c8._8_8_ = "\'--no-tests=\' given unknown value \'";
      local_228._8_8_ = local_228 + 0x10;
      local_228._0_8_ = &DAT_00000001;
      local_228[0x10] = '\'';
      local_1a8 = &DAT_00000001;
      views._M_len = 3;
      views._M_array = (iterator)local_1c8;
      local_1b8._M_allocated_capacity = (size_type)__n;
      local_1b8._8_8_ = __s1;
      local_1a0 = (pointer)local_228._8_8_;
      cmCatViews_abi_cxx11_((string *)local_1f8,views);
      std::__cxx11::string::operator=((string *)local_230,(string *)local_1f8);
      uVar14 = local_1f8._16_8_;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1f8 + 0x10)) {
LAB_0018cb81:
        operator_delete(paVar15,(ulong)(uVar14 + 1));
      }
      goto LAB_0018cb89;
    }
LAB_0018caf5:
    iVar7 = bcmp(__s1,"ignore",(size_t)__n);
    if (iVar7 != 0) goto LAB_0018cb0f;
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode = Ignore;
  }
  else {
    varg1_00._M_str = "--tests-information";
    varg1_00._M_len = (size_t)"-I";
    bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_00,pcVar13);
    if ((bVar6) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"TestsToRunInformation","");
      cmCTestGenericHandler::SetPersistentOption
                (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                 (string *)local_1c8,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"TestsToRunInformation","");
      cmCTestGenericHandler::SetPersistentOption
                ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,(string *)local_1c8
                 ,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
LAB_0018d545:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_0018d562;
    }
    else {
      varg1_01._M_str = "--union";
      varg1_01._M_len = (size_t)"-U";
      bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_01,pcVar13);
      if (!bVar6) {
        varg1_02._M_str = "--tests-regex";
        varg1_02._M_len = (size_t)"-R";
        bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_02,pcVar13);
        if ((bVar6) &&
           (*i < ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          *i = *i + 1;
          _Var3._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"IncludeRegularExpression","");
          cmCTestGenericHandler::SetPersistentOption
                    (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                     (string *)local_1c8,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
          }
          _Var3._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"IncludeRegularExpression","");
          cmCTestGenericHandler::SetPersistentOption
                    ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                     (string *)local_1c8,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
        }
        else {
          varg1_03._M_str = "--label-regex";
          varg1_03._M_len = (size_t)"-L";
          bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_03,pcVar13);
          if ((bVar6) &&
             (*i < ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            *i = *i + 1;
            _Var3._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"LabelRegularExpression","");
            cmCTestGenericHandler::AddPersistentMultiOption
                      (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                       (string *)local_1c8,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._0_8_ != &local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
            }
            _Var3._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"LabelRegularExpression","");
            cmCTestGenericHandler::AddPersistentMultiOption
                      ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                       (string *)local_1c8,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *i);
          }
          else {
            varg1_05._M_str = "--label-exclude";
            varg1_05._M_len = (size_t)"-LE";
            bVar6 = CheckArgument(&local_250,(string *)0x3,varg1_05,pcVar13);
            if ((bVar6) &&
               (*i < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              *i = *i + 1;
              _Var3._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              local_1c8._0_8_ = &local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"ExcludeLabelRegularExpression","");
              cmCTestGenericHandler::AddPersistentMultiOption
                        (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                         (string *)local_1c8,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._0_8_ != &local_1b8) {
                operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1)
                               );
              }
              _Var3._M_head_impl =
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              local_1c8._0_8_ = &local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"ExcludeLabelRegularExpression","");
              cmCTestGenericHandler::AddPersistentMultiOption
                        ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                         (string *)local_1c8,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i);
            }
            else {
              varg1_06._M_str = "--exclude-regex";
              varg1_06._M_len = (size_t)"-E";
              bVar6 = CheckArgument(&local_250,(string *)&DAT_00000002,varg1_06,pcVar13);
              if ((bVar6) &&
                 (*i < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                *i = *i + 1;
                _Var3._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"ExcludeRegularExpression","");
                cmCTestGenericHandler::SetPersistentOption
                          (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                           (string *)local_1c8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != &local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,
                                  (ulong)(local_1b8._M_allocated_capacity + 1));
                }
                _Var3._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                local_1c8._0_8_ = &local_1b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"ExcludeRegularExpression","");
                cmCTestGenericHandler::SetPersistentOption
                          ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                           (string *)local_1c8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
              }
              else {
                varg1_07._M_str = "--fixture-exclude-any";
                varg1_07._M_len = (size_t)"-FA";
                bVar6 = CheckArgument(&local_250,(string *)0x3,varg1_07,pcVar13);
                if ((bVar6) &&
                   (*i < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                  *i = *i + 1;
                  _Var3._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  local_1c8._0_8_ = &local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8,"ExcludeFixtureRegularExpression","");
                  cmCTestGenericHandler::SetPersistentOption
                            (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                             (string *)local_1c8,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._0_8_ != &local_1b8) {
                    operator_delete((void *)local_1c8._0_8_,
                                    (ulong)(local_1b8._M_allocated_capacity + 1));
                  }
                  _Var3._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  local_1c8._0_8_ = &local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8,"ExcludeFixtureRegularExpression","");
                  cmCTestGenericHandler::SetPersistentOption
                            ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                             (string *)local_1c8,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                }
                else {
                  varg1_09._M_str = "--fixture-exclude-setup";
                  varg1_09._M_len = (size_t)"-FS";
                  bVar6 = CheckArgument(&local_250,(string *)0x3,varg1_09,pcVar13);
                  if ((bVar6) &&
                     (*i < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                    *i = *i + 1;
                    _Var3._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureSetupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_ != &local_1b8) {
                      operator_delete((void *)local_1c8._0_8_,
                                      (ulong)(local_1b8._M_allocated_capacity + 1));
                    }
                    _Var3._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureSetupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  }
                  else {
                    varg1_10._M_str = "--fixture-exclude-cleanup";
                    varg1_10._M_len = (size_t)"-FC";
                    bVar6 = CheckArgument(&local_250,(string *)0x3,varg1_10,pcVar13);
                    if ((!bVar6) ||
                       (((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i)) {
                      bVar6 = true;
                      if (local_248 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0xe) {
                        iVar7 = bcmp((void *)local_250.Impl._M_t.
                                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                             .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                             _M_head_impl,"--rerun-failed",0xe);
                        if (iVar7 != 0) goto LAB_0018d565;
                        _Var3._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        local_1c8._0_8_ = &local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8,"RerunFailed","");
                        cmCTestGenericHandler::SetPersistentOption
                                  (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                                   (string *)local_1c8,"true");
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ != &local_1b8) {
                          operator_delete((void *)local_1c8._0_8_,
                                          (ulong)(local_1b8._M_allocated_capacity + 1));
                        }
                        _Var3._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        local_1c8._0_8_ = &local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8,"RerunFailed","");
                        cmCTestGenericHandler::SetPersistentOption
                                  ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                                   (string *)local_1c8,"true");
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ == &local_1b8) goto LAB_0018d565;
                      }
                      else {
                        if (((local_248 !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000014) ||
                            (iVar7 = bcmp((void *)local_250.Impl._M_t.
                                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                                  _M_head_impl,"--resource-spec-file",0x14),
                            iVar7 != 0)) ||
                           (((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= *i))
                        goto LAB_0018d565;
                        *i = *i + 1;
                        _Var3._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        local_1c8._0_8_ = &local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8,"ResourceSpecFile","");
                        cmCTestGenericHandler::SetPersistentOption
                                  (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                                   (string *)local_1c8,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ != &local_1b8) {
                          operator_delete((void *)local_1c8._0_8_,
                                          (ulong)(local_1b8._M_allocated_capacity + 1));
                        }
                        _Var3._M_head_impl =
                             (this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                        local_1c8._0_8_ = &local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8,"ResourceSpecFile","");
                        cmCTestGenericHandler::SetPersistentOption
                                  ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                                   (string *)local_1c8,
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ == &local_1b8) goto LAB_0018d565;
                      }
                      operator_delete((void *)local_1c8._0_8_,
                                      (ulong)(local_1b8._M_allocated_capacity + 1));
                      goto LAB_0018d565;
                    }
                    *i = *i + 1;
                    _Var3._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureCleanupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_ != &local_1b8) {
                      operator_delete((void *)local_1c8._0_8_,
                                      (ulong)(local_1b8._M_allocated_capacity + 1));
                    }
                    _Var3._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_1c8._0_8_ = &local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8,"ExcludeFixtureCleanupRegularExpression","");
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,
                               (string *)local_1c8,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
                  }
                }
              }
            }
          }
        }
        goto LAB_0018d545;
      }
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"UseUnion","");
      cmCTestGenericHandler::SetPersistentOption
                (&((_Var3._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                 (string *)local_1c8,"true");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
      }
      _Var3._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"UseUnion","");
      cmCTestGenericHandler::SetPersistentOption
                ((cmCTestGenericHandler *)&(_Var3._M_head_impl)->MemCheckHandler,(string *)local_1c8
                 ,"true");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ == &local_1b8) goto LAB_0018d562;
    }
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
LAB_0018d562:
  bVar6 = true;
LAB_0018d565:
  if (local_250.Impl._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
      (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_240) {
    operator_delete((void *)local_250.Impl._M_t.
                            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                            .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                    local_240[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F"_s)) {
    this->Impl->Failover = true;
  } else if (this->CheckArgument(arg, "-j"_s, "--parallel") &&
             i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  } else if (cmHasPrefix(arg, "-j")) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  }

  else if (this->CheckArgument(arg, "--repeat-until-fail"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmStrToLong(args[i], &repeat)) {
      errormsg = cmStrCat("'--repeat-until-fail' given non-integer value '",
                          args[i], "'");
      return false;
    }
    this->Impl->RepeatCount = static_cast<int>(repeat);
    if (repeat > 1) {
      this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
    }
  }

  else if (this->CheckArgument(arg, "--repeat"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    cmsys::RegularExpression repeatRegex(
      "^(until-fail|until-pass|after-timeout):([0-9]+)$");
    if (repeatRegex.find(args[i])) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->Impl->RepeatCount = static_cast<int>(n);
      if (this->Impl->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "until-fail") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "until-pass") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "after-timeout") {
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      errormsg = cmStrCat("'--repeat' given invalid value '", args[i], "'");
      return false;
    }
  }

  else if (this->CheckArgument(arg, "--test-load"_s) && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmStrToULong(args[i], &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  else if (this->CheckArgument(arg, "--no-compress-output"_s)) {
    this->Impl->CompressTestOutput = false;
  }

  else if (this->CheckArgument(arg, "--print-labels"_s)) {
    this->Impl->PrintLabels = true;
  }

  else if (this->CheckArgument(arg, "--http1.0"_s)) {
    this->Impl->UseHTTP10 = true;
  }

  else if (this->CheckArgument(arg, "--timeout"_s) && i < args.size() - 1) {
    i++;
    auto timeout = cmDuration(atof(args[i].c_str()));
    this->Impl->GlobalTimeout = timeout;
  }

  else if (this->CheckArgument(arg, "--stop-time"_s) && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  else if (this->CheckArgument(arg, "--stop-on-failure"_s)) {
    this->Impl->StopOnFailure = true;
  }

  else if (this->CheckArgument(arg, "-C"_s, "--build-config") &&
           i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i]);
  }

  else if (this->CheckArgument(arg, "--debug"_s)) {
    this->Impl->Debug = true;
    this->Impl->ShowLineNumbers = true;
  } else if ((this->CheckArgument(arg, "--group"_s) ||
              // This is an undocumented / deprecated option.
              // "Track" has been renamed to "Group".
              this->CheckArgument(arg, "--track"_s)) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SpecificGroup = args[i];
  } else if (this->CheckArgument(arg, "--show-line-numbers"_s)) {
    this->Impl->ShowLineNumbers = true;
  } else if (this->CheckArgument(arg, "--no-label-summary"_s)) {
    this->Impl->LabelSummary = false;
  } else if (this->CheckArgument(arg, "--no-subproject-summary"_s)) {
    this->Impl->SubprojectSummary = false;
  } else if (this->CheckArgument(arg, "-Q"_s, "--quiet")) {
    this->Impl->Quiet = true;
  } else if (this->CheckArgument(arg, "--progress"_s)) {
    this->Impl->TestProgressOutput = true;
  } else if (this->CheckArgument(arg, "-V"_s, "--verbose")) {
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "-VV"_s, "--extra-verbose")) {
    this->Impl->ExtraVerbose = true;
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "--output-on-failure"_s)) {
    this->Impl->OutputTestOutputOnTestFailure = true;
  } else if (this->CheckArgument(arg, "--test-output-size-passed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-size-failed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-truncation"_s) &&
             i < args.size() - 1) {
    i++;
    if (!this->Impl->TestHandler.SetTestOutputTruncation(args[i])) {
      errormsg = "Invalid value for '--test-output-truncation': " + args[i];
      return false;
    }
  } else if (this->CheckArgument(arg, "-N"_s, "--show-only")) {
    this->Impl->ShowOnly = true;
  } else if (cmHasLiteralPrefix(arg, "--show-only=")) {
    this->Impl->ShowOnly = true;

    // Check if a specific format is requested. Defaults to human readable
    // text.
    std::string argWithFormat = "--show-only=";
    std::string format = arg.substr(argWithFormat.length());
    if (format == "json-v1") {
      // Force quiet mode so the only output is the json object model.
      this->Impl->Quiet = true;
      this->Impl->OutputAsJson = true;
      this->Impl->OutputAsJsonVersion = 1;
    } else if (format != "human") {
      errormsg = "'--show-only=' given unknown value '" + format + "'";
      return false;
    }
  }

  else if (this->CheckArgument(arg, "-O"_s, "--output-log") &&
           i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i]);
  }

  else if (this->CheckArgument(arg, "--tomorrow-tag"_s)) {
    this->Impl->TomorrowTag = true;
  } else if (this->CheckArgument(arg, "--force-new-ctest-process"_s)) {
    this->Impl->ForceNewCTestProcess = true;
  } else if (this->CheckArgument(arg, "-W"_s, "--max-width") &&
             i < args.size() - 1) {
    i++;
    this->Impl->MaxTestNameWidth = atoi(args[i].c_str());
  } else if (this->CheckArgument(arg, "--interactive-debug-mode"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->InteractiveDebugMode = cmIsOn(args[i]);
  } else if (this->CheckArgument(arg, "--submit-index"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SubmitIndex = atoi(args[i].c_str());
    if (this->Impl->SubmitIndex < 0) {
      this->Impl->SubmitIndex = 0;
    }
  }

  else if (this->CheckArgument(arg, "--overwrite"_s) && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  } else if (this->CheckArgument(arg, "-A"_s, "--add-notes") &&
             i < args.size() - 1) {
    this->Impl->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i]);
    return true;
  } else if (this->CheckArgument(arg, "--test-dir"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--test-dir' requires an argument";
      return false;
    }
    i++;
    this->Impl->TestDir = std::string(args[i]);
  } else if (this->CheckArgument(arg, "--output-junit"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--output-junit' requires an argument";
      return false;
    }
    i++;
    this->SetOutputJUnitFileName(std::string(args[i]));
  }

  cm::string_view noTestsPrefix = "--no-tests=";
  if (cmHasPrefix(arg, noTestsPrefix)) {
    cm::string_view noTestsMode =
      cm::string_view(arg).substr(noTestsPrefix.length());
    if (noTestsMode == "error") {
      this->Impl->NoTestsMode = cmCTest::NoTests::Error;
    } else if (noTestsMode != "ignore") {
      errormsg =
        cmStrCat("'--no-tests=' given unknown value '", noTestsMode, '\'');
      return false;
    } else {
      this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
    }
  }

  // options that control what tests are run
  else if (this->CheckArgument(arg, "-I"_s, "--tests-information") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("TestsToRunInformation",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("TestsToRunInformation",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-U"_s, "--union")) {
    this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
    this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
  } else if (this->CheckArgument(arg, "-R"_s, "--tests-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("IncludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("IncludeRegularExpression",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-L"_s, "--label-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption("LabelRegularExpression",
                                                     args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "LabelRegularExpression", args[i]);
  } else if (this->CheckArgument(arg, "-LE"_s, "--label-exclude") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
  }

  else if (this->CheckArgument(arg, "-E"_s, "--exclude-regex") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "-FA"_s, "--fixture-exclude-any") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FS"_s, "--fixture-exclude-setup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FC"_s, "--fixture-exclude-cleanup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--resource-spec-file"_s) &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ResourceSpecFile",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ResourceSpecFile",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--rerun-failed"_s)) {
    this->GetTestHandler()->SetPersistentOption("RerunFailed", "true");
    this->GetMemCheckHandler()->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}